

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundFunctionExpression::Serialize(BoundFunctionExpression *this,Serializer *serializer)

{
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,200,"return_type",&(this->super_Expression).return_type);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"children");
  Serializer::
  WriteValue<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,&this->children);
  (*serializer->_vptr_Serializer[3])(serializer);
  FunctionSerializer::Serialize<duckdb::ScalarFunction>
            (serializer,&this->function,
             (optional_ptr<duckdb::FunctionData,_true>)
             (this->bind_info).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
  (*serializer->_vptr_Serializer[2])(serializer,0xca,"is_operator");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->is_operator);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void BoundFunctionExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WriteProperty(200, "return_type", return_type);
	serializer.WriteProperty(201, "children", children);
	FunctionSerializer::Serialize(serializer, function, bind_info.get());
	serializer.WriteProperty(202, "is_operator", is_operator);
}